

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void emit_lib(BuildCtx *ctx)

{
  char **ppcVar1;
  bool bVar2;
  FILE *__stream;
  undefined8 uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  size_t local_170;
  uint8_t *local_158;
  char *p_1;
  int i;
  size_t len;
  size_t n;
  LibDefHandler *ldh;
  int lvl;
  int ok;
  char *p;
  FILE *fp;
  char buf [256];
  char *fname;
  BuildCtx *ctx_local;
  
  if (((ctx->mode == BUILD_ffdef) || (ctx->mode == BUILD_libdef)) || (ctx->mode == BUILD_recdef)) {
    fprintf((FILE *)ctx->fp,"/* This is a generated file. DO NOT EDIT! */\n\n");
  }
  else if (ctx->mode == BUILD_vmdef) {
    fprintf((FILE *)ctx->fp,"ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  }
  if (ctx->mode == BUILD_recdef) {
    fprintf((FILE *)ctx->fp,"static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  }
  ffid = 2;
  recffid = 2;
  ffasmfunc = 0;
  do {
    ppcVar1 = ctx->args;
    ctx->args = ppcVar1 + 1;
    buf._248_8_ = *ppcVar1;
    if ((char *)buf._248_8_ == (char *)0x0) {
      if (ctx->mode == BUILD_ffdef) {
        fprintf((FILE *)ctx->fp,"\n#undef FFDEF\n\n");
        fprintf((FILE *)ctx->fp,"#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
                (ulong)(uint)ffasmfunc);
      }
      else if (ctx->mode == BUILD_vmdef) {
        fprintf((FILE *)ctx->fp,"},\n\n");
      }
      else if (ctx->mode == BUILD_bcdef) {
        fprintf((FILE *)ctx->fp,"\n};\n\n");
        fprintf((FILE *)ctx->fp,"LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
        fprintf((FILE *)ctx->fp,"BCDEF(BCMODE)\n");
        p_1._4_4_ = ffasmfunc;
        while (p_1._4_4_ = p_1._4_4_ + -1, 0 < p_1._4_4_) {
          fprintf((FILE *)ctx->fp,"BCMODE_FF,\n");
        }
        fprintf((FILE *)ctx->fp,"BCMODE_FF\n};\n\n");
      }
      else if (ctx->mode == BUILD_recdef) {
        local_158 = obuf;
        fprintf((FILE *)ctx->fp,"\n};\n\n");
        fprintf((FILE *)ctx->fp,"static const RecordFunc recff_func[] = {\nrecff_nyi,\nrecff_c");
        for (; *local_158 != '\0'; local_158 = local_158 + sVar7 + 1) {
          fprintf((FILE *)ctx->fp,",\nrecff_%s",local_158);
          sVar7 = strlen((char *)local_158);
        }
        fprintf((FILE *)ctx->fp,"\n};\n\n");
      }
      return;
    }
    if ((*(char *)buf._248_8_ == '-') && (*(char *)(buf._248_8_ + 1) == '\0')) {
      p = _stdin;
    }
    else {
      p = (char *)fopen((char *)buf._248_8_,"r");
      uVar3 = buf._248_8_;
      __stream = _stderr;
      if ((FILE *)p == (FILE *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(__stream,"Error: cannot open input file \'%s\': %s\n",uVar3,pcVar6);
        exit(1);
      }
    }
    modstate = 0;
    regfunc = 0;
LAB_0010d8fd:
    pcVar6 = fgets((char *)&fp,0x100,(FILE *)p);
    if (pcVar6 != (char *)0x0) {
      if ((((char)fp == '#') && (fp._1_1_ == 'i')) && (fp._2_1_ == 'f')) {
        iVar4 = strcmp((char *)&fp,"#if LJ_52\n");
        if ((iVar4 == 0) || (iVar4 = strcmp((char *)&fp,"#if LJ_52\r\n"), iVar4 == 0)) {
          bVar2 = false;
        }
        else {
          iVar4 = strcmp((char *)&fp,"#if LJ_HASJIT\n");
          if ((((iVar4 != 0) && (iVar4 = strcmp((char *)&fp,"#if LJ_HASJIT\r\n"), iVar4 != 0)) &&
              (iVar4 = strcmp((char *)&fp,"#if LJ_HASFFI\n"), iVar4 != 0)) &&
             ((iVar4 = strcmp((char *)&fp,"#if LJ_HASFFI\r\n"), iVar4 != 0 &&
              (iVar4 = strcmp((char *)&fp,"#if LJ_HASBUFFER\n"), iVar4 != 0)))) {
            strcmp((char *)&fp,"#if LJ_HASBUFFER\r\n");
          }
          bVar2 = true;
        }
        if (bVar2) goto LAB_0010db02;
        ldh._0_4_ = 1;
        do {
          while( true ) {
            pcVar6 = fgets((char *)&fp,0x100,(FILE *)p);
            if (pcVar6 == (char *)0x0) goto LAB_0010d8fd;
            if ((((char)fp == '#') && (fp._1_1_ == 'e')) && (fp._2_1_ == 'n')) break;
            if ((((char)fp == '#') && (fp._1_1_ == 'i')) && (fp._2_1_ == 'f')) {
              ldh._0_4_ = (int)ldh + 1;
            }
          }
          ldh._0_4_ = (int)ldh + -1;
        } while ((int)ldh != 0);
      }
      else {
LAB_0010db02:
        _lvl = &fp;
        while (pcVar6 = strstr((char *)_lvl,"LJLIB_"), pcVar6 != (char *)0x0) {
          _lvl = (FILE **)(pcVar6 + 6);
          for (n = (size_t)libdef_handlers; *(long *)n != 0; n = n + 0x20) {
            sVar7 = strlen(*(char **)n);
            iVar4 = strncmp((char *)_lvl,*(char **)n,sVar7);
            if (iVar4 == 0) {
              _lvl = (FILE **)(sVar7 + (long)_lvl);
              if (*(long *)(n + 8) == 0) {
                local_170 = 0;
              }
              else {
                local_170 = strcspn((char *)_lvl,*(char **)(n + 8));
              }
              if (*(char *)((long)_lvl + local_170) != '\0') {
                *(char *)((long)_lvl + local_170) = '\0';
                (**(code **)(n + 0x10))(ctx,_lvl,*(undefined4 *)(n + 0x18));
                _lvl = (FILE **)(local_170 + 1 + (long)_lvl);
              }
              break;
            }
          }
          if (*(long *)n == 0) {
            sVar7 = strlen((char *)&fp);
            *(undefined1 *)((long)&p + sVar7 + 7) = 0;
            fprintf(_stderr,"Error: unknown library definition tag %s%s\n","LJLIB_",_lvl);
            exit(1);
          }
        }
      }
      goto LAB_0010d8fd;
    }
    fclose((FILE *)p);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  } while( true );
}

Assistant:

void emit_lib(BuildCtx *ctx)
{
  const char *fname;

  if (ctx->mode == BUILD_ffdef || ctx->mode == BUILD_libdef ||
      ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  else if (ctx->mode == BUILD_vmdef)
    fprintf(ctx->fp, "ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  if (ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  recffid = ffid = FF_C+1;
  ffasmfunc = 0;

  while ((fname = *ctx->args++)) {
    char buf[256];  /* We don't care about analyzing lines longer than that. */
    FILE *fp;
    if (fname[0] == '-' && fname[1] == '\0') {
      fp = stdin;
    } else {
      fp = fopen(fname, "r");
      if (!fp) {
	fprintf(stderr, "Error: cannot open input file '%s': %s\n",
		fname, strerror(errno));
	exit(1);
      }
    }
    modstate = 0;
    regfunc = REGFUNC_OK;
    while (fgets(buf, sizeof(buf), fp) != NULL) {
      char *p;
      /* Simplistic pre-processor. Only handles top-level #if/#endif. */
      if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
        int ok = 1;
        if (!strcmp(buf, "#if LJ_52\n") || !strcmp(buf, "#if LJ_52\r\n"))
          ok = LJ_52;
        else if (!strcmp(buf, "#if LJ_HASJIT\n") || !strcmp(buf, "#if LJ_HASJIT\r\n"))
          ok = LJ_HASJIT;
        else if (!strcmp(buf, "#if LJ_HASFFI\n") || !strcmp(buf, "#if LJ_HASFFI\r\n"))
          ok = LJ_HASFFI;
        else if (!strcmp(buf, "#if LJ_HASBUFFER\n") || !strcmp(buf, "#if LJ_HASBUFFER\r\n"))
          ok = LJ_HASBUFFER;
        if (!ok) {
          int lvl = 1;
          while (fgets(buf, sizeof(buf), fp) != NULL) {
            if (buf[0] == '#' && buf[1] == 'e' && buf[2] == 'n') {
              if (--lvl == 0) break;
            } else if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
              lvl++;
            }
          }
          continue;
        }
      }
      for (p = buf; (p = strstr(p, LIBDEF_PREFIX)) != NULL; ) {
        const LibDefHandler *ldh;
        p += sizeof(LIBDEF_PREFIX)-1;
        for (ldh = libdef_handlers; ldh->suffix != NULL; ldh++) {
          size_t n, len = strlen(ldh->suffix);
          if (!strncmp(p, ldh->suffix, len)) {
            p += len;
            n = ldh->stop ? strcspn(p, ldh->stop) : 0;
            if (!p[n]) break;
            p[n] = '\0';
            ldh->func(ctx, p, ldh->arg);
            p += n+1;
            break;
          }
        }
        if (ldh->suffix == NULL) {
          buf[strlen(buf)-1] = '\0';
          fprintf(stderr, "Error: unknown library definition tag %s%s\n",
            LIBDEF_PREFIX, p);
          exit(1);
        }
      }
    }
    fclose(fp);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }

  if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "\n#undef FFDEF\n\n");
    fprintf(ctx->fp,
      "#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
      ffasmfunc);
  } else if (ctx->mode == BUILD_vmdef) {
    fprintf(ctx->fp, "},\n\n");
  } else if (ctx->mode == BUILD_bcdef) {
    int i;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
    fprintf(ctx->fp, "BCDEF(BCMODE)\n");
    for (i = ffasmfunc-1; i > 0; i--)
      fprintf(ctx->fp, "BCMODE_FF,\n");
    fprintf(ctx->fp, "BCMODE_FF\n};\n\n");
  } else if (ctx->mode == BUILD_recdef) {
    char *p = (char *)obuf;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "static const RecordFunc recff_func[] = {\n"
	    "recff_nyi,\n"
	    "recff_c");
    while (*p) {
      fprintf(ctx->fp, ",\nrecff_%s", p);
      p += strlen(p)+1;
    }
    fprintf(ctx->fp, "\n};\n\n");
  }
}